

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhinull.cpp
# Opt level: O0

void __thiscall QRhiNull::simulateTextureGenMips(QRhiNull *this,TextureOp *u)

{
  long lVar1;
  int iVar2;
  QSize this_00;
  array<QImage,_16UL> *in_RSI;
  long in_FS_OFFSET;
  int level;
  int levelCount;
  QNullTexture *texD;
  QSize baseSize;
  reference in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  int iVar3;
  undefined4 in_stack_ffffffffffffffb4;
  QImage *this_01;
  TransformationMode in_stack_ffffffffffffffe0;
  AspectRatioMode in_stack_ffffffffffffffe4;
  QSize *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = *(QImage **)&in_RSI->field_0x8;
  this_00 = QRhiTexture::pixelSize
                      ((QRhiTexture *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0))
  ;
  iVar2 = QRhi::mipLevelsForSize
                    ((QSize *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  for (iVar3 = 1; iVar3 < iVar2; iVar3 = iVar3 + 1) {
    QVLABase<std::array<QImage,_16UL>_>::operator[]
              ((QVLABase<std::array<QImage,_16UL>_> *)in_stack_ffffffffffffffa8,0x6afa64);
    in_stack_ffffffffffffffa8 = std::array<QImage,_16UL>::operator[](in_RSI,(size_type)this_01);
    QRhi::sizeForMipLevel((int)((ulong)in_RSI >> 0x20),(QSize *)this_01);
    QImage::scaled((QImage *)this_00,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe4,
                   in_stack_ffffffffffffffe0);
    QVLABase<std::array<QImage,_16UL>_>::operator[]
              ((QVLABase<std::array<QImage,_16UL>_> *)in_stack_ffffffffffffffa8,0x6afab2);
    std::array<QImage,_16UL>::operator[](in_RSI,(size_type)this_01);
    QImage::operator=(this_01,(QImage *)CONCAT44(iVar2,iVar3));
    QImage::~QImage((QImage *)CONCAT44(iVar2,iVar3));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QRhiNull::simulateTextureGenMips(const QRhiResourceUpdateBatchPrivate::TextureOp &u)
{
    QNullTexture *texD = QRHI_RES(QNullTexture, u.dst);
    const QSize baseSize = texD->pixelSize();
    const int levelCount = q->mipLevelsForSize(baseSize);
    for (int level = 1; level < levelCount; ++level)
        texD->image[0][level] = texD->image[0][0].scaled(q->sizeForMipLevel(level, baseSize));
}